

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void wasm::SimplifyLocals<true,_true,_true>::visitPre
               (SimplifyLocals<true,_true,_true> *self,Expression **currp)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  Expression *pEVar3;
  PassRunner *pPVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  undefined1 auVar9 [8];
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
  pVar10;
  undefined1 auStack_1a8 [8];
  EffectAnalyzer effects;
  key_type local_34 [2];
  uint index;
  
  pEVar3 = *currp;
  if ((pEVar3->_id & ~BlockId) == TryId) {
    auStack_1a8 = (undefined1  [8])0x0;
    effects.ignoreImplicitTraps = false;
    effects.trapsNeverHappen = false;
    effects._2_6_ = 0;
    effects.module = (Module *)0x0;
    p_Var8 = (self->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(self->sinkables)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      do {
        if ((*(char *)((long)&p_Var8[8]._M_left + 3) != '\0') ||
           (p_Var8[0xc]._M_parent != (_Base_ptr)0x0)) {
          if ((Module *)effects._0_8_ == effects.module) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_1a8,
                       (iterator)effects._0_8_,&p_Var8[1]._M_color);
          }
          else {
            *(_Rb_tree_color *)effects._0_8_ = p_Var8[1]._M_color;
            effects._0_8_ = effects._0_8_ + 4;
          }
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        uVar7 = effects._0_8_;
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      if (auStack_1a8 != (undefined1  [8])effects._0_8_) {
        auVar9 = auStack_1a8;
        do {
          local_34[0] = *(key_type *)auVar9;
          pVar10 = std::
                   _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                   ::equal_range(&(self->sinkables)._M_t,local_34);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
          ::_M_erase_aux(&(self->sinkables)._M_t,(_Base_ptr)pVar10.first._M_node,
                         (_Base_ptr)pVar10.second._M_node);
          auVar9 = (undefined1  [8])((long)auVar9 + 4);
        } while (auVar9 != (undefined1  [8])uVar7);
      }
      if (auStack_1a8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_1a8,(long)effects.module - (long)auStack_1a8);
      }
    }
  }
  auVar9 = auStack_1a8;
  pPVar4 = (self->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
           ).super_Pass.runner;
  effects._0_8_ =
       (self->
       super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
       ).
       super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
       .
       super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
       .
       super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
       .currModule;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.localsRead;
  uVar5 = (pPVar4->options).ignoreImplicitTraps;
  uVar6 = (pPVar4->options).trapsNeverHappen;
  auStack_1a8[1] = uVar6;
  auStack_1a8[0] = uVar5;
  auStack_1a8._2_6_ = auVar9._2_6_;
  uVar2 = (((Module *)effects._0_8_)->features).features;
  effects.module._0_6_ = CONCAT24(0,uVar2);
  effects.localsRead._M_t._M_impl._0_4_ = 0;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.localsWritten;
  effects.localsWritten._M_t._M_impl._0_4_ = 0;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.mutableGlobalsRead;
  effects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.globalsWritten;
  effects.globalsWritten._M_t._M_impl._0_4_ = 0;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.breakTargets;
  effects.breakTargets._M_t._M_impl._0_4_ = 0;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.readsMemory = false;
  effects.writesMemory = false;
  effects.readsTable = false;
  effects.writesTable = false;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  effects.trap = false;
  effects.implicitTrap = false;
  effects.isAtomic = false;
  effects.throws_ = false;
  effects._228_4_ = 0;
  effects.tryDepth._0_7_ = 0;
  effects._239_4_ = 0;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.delegateTargets;
  effects.delegateTargets._M_t._M_impl._0_4_ = 0;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (pEVar3->_id == LoopId) {
    effects.module._0_5_ = CONCAT14(1,uVar2);
    checkInvalidations(self,(EffectAnalyzer *)auStack_1a8);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&effects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&effects.features);
  return;
}

Assistant:

static void
  visitPre(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
           Expression** currp) {
    Expression* curr = *currp;

    // Certain expressions cannot be sinked into 'try'/'try_table', and so at
    // the start of 'try'/'try_table' we forget about them.
    if (curr->is<Try>() || curr->is<TryTable>()) {
      std::vector<Index> invalidated;
      for (auto& [index, info] : self->sinkables) {
        // Expressions that may throw cannot be moved into a try (which might
        // catch them, unlike before the move).
        if (info.effects.throws()) {
          invalidated.push_back(index);
          continue;
        }
      }
      for (auto index : invalidated) {
        self->sinkables.erase(index);
      }
    }

    EffectAnalyzer effects(self->getPassOptions(), *self->getModule());
    if (effects.checkPre(curr)) {
      self->checkInvalidations(effects);
    }

    if (!allowNesting) {
      self->expressionStack.push_back(curr);
    }
  }